

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.hpp
# Opt level: O3

string * __thiscall
njoy::ENDFtk::tree::Tape::content_abi_cxx11_(string *__return_storage_ptr__,Tape *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output_1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  int local_88 [2];
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_78 [16];
  string local_68;
  int local_48 [6];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->tpid_).super__Optional_base<njoy::ENDFtk::TapeIdentification,_false,_false>._M_payload.
      super__Optional_payload<njoy::ENDFtk::TapeIdentification,_true,_false,_false>.
      super__Optional_payload_base<njoy::ENDFtk::TapeIdentification>._M_engaged == true) {
    local_80.container = local_80.container & 0xffffffff00000000;
    local_88[1] = 0;
    local_88[0] = 0;
    local_78._0_8_ = __return_storage_ptr__;
    tools::disco::Character<66u>::
    write<std::__cxx11::string,std::back_insert_iterator<std::__cxx11::string>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78);
    tools::disco::
    Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78,(int *)&local_80,local_88 + 1,local_88);
  }
  p_Var1 = (this->materials_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->materials_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      Material::content_abi_cxx11_((string *)local_78,(Material *)&p_Var1[1]._M_parent);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_78._0_8_);
      if ((string *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_dataplus._M_p + 1));
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    local_68.field_2._M_allocated_capacity = 0;
    local_68.field_2._8_8_ = 0;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_78._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_78._8_8_ = 0;
    local_48[0] = -1;
    local_48[1] = 0;
    local_48[2] = 0;
    local_80.container = __return_storage_ptr__;
    StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
              ((StructureDivision *)local_78,&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

auto content() const {

      std::string content;
      if ( this->tpid_ ) {

        auto output = std::back_inserter( content );
        this->tpid_->print( output, 0, 0, 0 );
      }

      for ( const auto& material : this->materials() ) {

        content += material.content();
      }

      if ( content.size() ) {

        auto output = std::back_inserter( content );
        TEND().print( output );
      }

      return content;
    }